

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O1

void do_bidi(BidiContext *ctx,bidi_char *text,size_t textlen)

{
  ctx->paragraphOverride = ON;
  do_bidi_new(ctx,text,textlen);
  return;
}

Assistant:

void do_bidi(BidiContext *ctx, bidi_char *text, size_t textlen)
{
#ifdef REMOVE_FORMATTING_CHARACTERS
    abort(); /* can't use the standard algorithm in a live terminal */
#else
    ctx->paragraphOverride = ON;
    do_bidi_new(ctx, text, textlen);
#endif
}